

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IT8951.c
# Opt level: O0

void IT8951LoadImgStart(IT8951LdImgInfo *pstLdImgInfo)

{
  uint16_t uVar1;
  uint16_t uVar2;
  ushort uVar3;
  uint16_t usArg;
  IT8951LdImgInfo *pstLdImgInfo_local;
  
  uVar1 = pstLdImgInfo->usEndianType;
  uVar2 = pstLdImgInfo->usPixelFormat;
  uVar3 = pstLdImgInfo->usRotate;
  LCDWriteCmdCode(0x20);
  LCDWriteData(uVar1 << 8 | uVar2 << 4 | uVar3);
  return;
}

Assistant:

void IT8951LoadImgStart(IT8951LdImgInfo* pstLdImgInfo)
{
    uint16_t usArg;
    //Setting Argument for Load image start
    usArg = (pstLdImgInfo->usEndianType << 8 )
    |(pstLdImgInfo->usPixelFormat << 4)
    |(pstLdImgInfo->usRotate);
    //Send Cmd
    LCDWriteCmdCode(IT8951_TCON_LD_IMG);
    //Send Arg
    LCDWriteData(usArg);
}